

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::setupHfwLayoutData(QFormLayoutPrivate *this)

{
  QList<QLayoutStruct> *this_00;
  int iVar1;
  int iVar2;
  QFormLayout *this_01;
  QLayoutStruct *pQVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  pointer pQVar12;
  pointer ppQVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint local_58;
  
  this_01 = *(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8;
  uVar16 = (this->m_matrix).m_storage.d.size;
  this_00 = &this->hfwLayouts;
  QList<QLayoutStruct>::clear(this_00);
  QList<QLayoutStruct>::resize(this_00,(long)this->vLayoutCount);
  if (0 < this->vLayoutCount) {
    lVar15 = 0;
    lVar17 = 0;
    do {
      pQVar3 = (this->vLayouts).d.ptr;
      pQVar12 = QList<QLayoutStruct>::data(this_00);
      puVar4 = (undefined8 *)((long)&pQVar3->stretch + lVar15);
      uVar6 = *puVar4;
      uVar7 = puVar4[1];
      puVar4 = (undefined8 *)((long)&pQVar3->spacing + lVar15);
      uVar8 = puVar4[1];
      puVar5 = (undefined8 *)((long)&pQVar12->spacing + lVar15);
      *puVar5 = *puVar4;
      puVar5[1] = uVar8;
      puVar4 = (undefined8 *)((long)&pQVar12->stretch + lVar15);
      *puVar4 = uVar6;
      puVar4[1] = uVar7;
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar17 < this->vLayoutCount);
  }
  local_58 = (uint)(uVar16 >> 1);
  if (0 < (int)local_58) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      ppQVar13 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      puVar4 = *(undefined8 **)((long)ppQVar13 + lVar15);
      ppQVar13 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      puVar5 = *(undefined8 **)((long)ppQVar13 + lVar15 + 8);
      bVar9 = QFormLayout::isRowVisible(this_01,(int)uVar16);
      if (bVar9) {
        if ((puVar4 != (undefined8 *)0x0) && (iVar11 = *(int *)(puVar4 + 6), -1 < (long)iVar11)) {
          if (*(char *)((long)puVar4 + 10) == '\x01') {
            iVar10 = (**(code **)(*(long *)*puVar4 + 0x50))
                               ((long *)*puVar4,*(undefined4 *)(puVar4 + 7));
            iVar11 = *(int *)(puVar4 + 6);
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar11].minimumSize = iVar10;
            iVar11 = *(int *)(puVar4 + 6);
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar11].sizeHint = iVar10;
          }
          else {
            iVar10 = *(int *)(puVar4 + 3);
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar11].sizeHint = iVar10;
            iVar11 = *(int *)(puVar4 + 2);
            iVar10 = *(int *)(puVar4 + 6);
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar10].minimumSize = iVar11;
          }
        }
        if ((puVar5 != (undefined8 *)0x0) && (-1 < *(int *)(puVar5 + 6))) {
          iVar11 = 0;
          if (*(char *)((long)puVar5 + 10) == '\x01') {
            iVar11 = (**(code **)(*(long *)*puVar5 + 0x50))
                               ((long *)*puVar5,*(undefined4 *)(puVar5 + 7));
          }
          iVar10 = iVar11;
          if (*(char *)((long)puVar5 + 10) == '\0') {
            iVar10 = *(int *)(puVar5 + 3);
            iVar11 = *(int *)(puVar5 + 2);
          }
          iVar1 = *(int *)(puVar5 + 6);
          if (*(char *)((long)puVar5 + 0x2c) == '\x01') {
            pQVar3 = (this->hfwLayouts).d.ptr;
            iVar14 = pQVar3[iVar1].sizeHint;
            iVar2 = pQVar3[iVar1].minimumSize;
            if (iVar14 < iVar10) {
              iVar14 = iVar10;
            }
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar1].sizeHint = iVar14;
            if (iVar11 <= iVar2) {
              iVar11 = iVar2;
            }
          }
          else {
            pQVar12 = QList<QLayoutStruct>::data(this_00);
            pQVar12[iVar1].sizeHint = iVar10;
          }
          iVar10 = *(int *)(puVar5 + 6);
          pQVar12 = QList<QLayoutStruct>::data(this_00);
          pQVar12[iVar10].minimumSize = iVar11;
        }
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x10;
    } while ((local_58 & 0x7fffffff) != uVar16);
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupHfwLayoutData()
{
    Q_Q(QFormLayout);
    // setupVerticalLayoutData must be called before this
    // setupHorizontalLayoutData must also be called before this
    // copies non hfw data into hfw
    // then updates size and min


    // Note: QGridLayout doesn't call minimumHeightForWidth,
    // but instead uses heightForWidth for both min and sizeHint.
    // For the common case where minimumHeightForWidth just calls
    // heightForWidth, we do the calculation twice, which can be
    // very expensive for word wrapped QLabels/QTextEdits, for example.
    // So we just use heightForWidth as well.
    int i;
    int rr = m_matrix.rowCount();

    hfwLayouts.clear();
    hfwLayouts.resize(vLayoutCount);
    for (i = 0; i < vLayoutCount; ++i)
        hfwLayouts[i] = vLayouts.at(i);

    for (i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // ignore rows with only hidden items
        if (!q->isRowVisible(i))
            continue;

        if (label && label->vLayoutIndex > -1) {
            if (label->isHfw) {
                // We don't check sideBySide here, since a label is only
                // ever side by side with its field
                int hfw = label->heightForWidth(label->layoutWidth);
                hfwLayouts[label->vLayoutIndex].minimumSize = hfw;
                hfwLayouts[label->vLayoutIndex].sizeHint = hfw;
            } else {
                // Reset these here, so the field can do a qMax below (the previous value may have
                // been the fields non-hfw values, which are often larger than hfw)
                hfwLayouts[label->vLayoutIndex].sizeHint = label->sizeHint.height();
                hfwLayouts[label->vLayoutIndex].minimumSize = label->minSize.height();
            }
        }

        if (field && field->vLayoutIndex > -1) {
            int hfw = field->isHfw ? field->heightForWidth(field->layoutWidth) : 0;
            int h = field->isHfw ? hfw : field->sizeHint.height();
            int mh = field->isHfw ? hfw : field->minSize.height();

            if (field->sideBySide) {
                int oh = hfwLayouts.at(field->vLayoutIndex).sizeHint;
                int omh = hfwLayouts.at(field->vLayoutIndex).minimumSize;

                hfwLayouts[field->vLayoutIndex].sizeHint = qMax(h, oh);
                hfwLayouts[field->vLayoutIndex].minimumSize = qMax(mh, omh);
            } else {
                hfwLayouts[field->vLayoutIndex].sizeHint = h;
                hfwLayouts[field->vLayoutIndex].minimumSize = mh;
            }
        }
    }
}